

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.hpp
# Opt level: O1

size_t __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
::min_buckets_for_size
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_double>_>,_unsigned_int,_double,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
           *this,size_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,size);
  auVar5._0_8_ = auVar1._0_8_ / (double)this->mlf_;
  auVar5._8_8_ = auVar1._8_8_;
  auVar1 = vroundsd_avx(auVar5,auVar5,9);
  uVar2 = vcvttsd2usi_avx512f(auVar1);
  uVar4 = 0xffffffffffffffff;
  if (auVar1._0_8_ < 1.8446744073709552e+19) {
    uVar4 = uVar2;
  }
  sVar3 = 4;
  if (4 < uVar4 + 1) {
    uVar4 = uVar4 >> 1 | uVar4;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar4 = uVar4 >> 0x10 | uVar4;
    sVar3 = (uVar4 >> 0x20 | uVar4) + 1;
  }
  return sVar3;
}

Assistant:

std::size_t min_buckets_for_size(std::size_t size) const
        {
            BOOST_ASSERT(mlf_ >= minimum_max_load_factor);
    
            using namespace std;
    
            // From 6.3.1/13:
            // size < mlf_ * count
            // => count > size / mlf_
            //
            // Or from rehash post-condition:
            // count > size / mlf_

            return policy::new_bucket_count(
                boost::unordered::detail::double_to_size(floor(
                    static_cast<double>(size) /
                    static_cast<double>(mlf_))) + 1);
        }